

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  pointer pbVar1;
  pointer pcVar2;
  mapped_type pcVar3;
  double dVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  long *plVar11;
  mapped_type *ppcVar12;
  ostream *poVar13;
  cmCTestGenericHandler *pcVar14;
  _func_int **pp_Var15;
  string arg;
  long repeat;
  ostringstream cmCTestLog_msg;
  long *local_1f8 [2];
  long local_1e8 [2];
  unsigned_long local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [264];
  string *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1f8[0] = local_1e8;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  local_38 = errormsg;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->Failover = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i)
    goto LAB_00290823;
    sVar9 = *i + 1;
    *i = sVar9;
    iVar7 = atoi(pbVar1[sVar9]._M_dataplus._M_p);
LAB_00290885:
    iVar8 = 1;
    if (1 < iVar7) {
      iVar8 = iVar7;
    }
    this->ParallelLevel = iVar8;
    this->ParallelLevelSetInCli = true;
  }
  else {
LAB_00290823:
    lVar10 = std::__cxx11::string::find((char *)local_1f8,0x629173,0);
    if (lVar10 == 0) {
      std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_1f8);
      uVar5 = local_1b0._0_8_;
      iVar7 = atoi((char *)local_1b0._0_8_);
      if ((undefined1 *)uVar5 != local_1b0 + 0x10) {
        operator_delete((void *)uVar5,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
      }
      goto LAB_00290885;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= *i) {
      bVar6 = false;
      std::__cxx11::string::_M_replace
                ((ulong)local_38,0,(char *)local_38->_M_string_length,0x629195);
      goto LAB_00291cfa;
    }
    sVar9 = *i + 1;
    *i = sVar9;
    local_1d8 = 1;
    bVar6 = cmSystemTools::StringToLong(pbVar1[sVar9]._M_dataplus._M_p,(long *)&local_1d8);
    if (!bVar6) {
      std::operator+(&local_1d0,"\'--repeat-until-fail\' given non-integer value \'",
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + *i);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      pp_Var15 = (_func_int **)(plVar11 + 2);
      if ((_func_int **)*plVar11 == pp_Var15) {
        local_1a0[0]._0_8_ = *pp_Var15;
        local_1a0[0]._8_8_ = plVar11[3];
        local_1b0._0_8_ = local_1b0 + 0x10;
      }
      else {
        local_1a0[0]._0_8_ = *pp_Var15;
        local_1b0._0_8_ = (_func_int **)*plVar11;
      }
      local_1b0._8_8_ = plVar11[1];
      *plVar11 = (long)pp_Var15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_38,(string *)local_1b0);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
      goto LAB_00291cfa;
    }
    this->RepeatTests = (int)local_1d8;
    if (1 < (long)local_1d8) {
      this->RepeatUntilFail = true;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      bVar6 = cmSystemTools::StringToULong(pbVar1[sVar9]._M_dataplus._M_p,&local_1d8);
      if (bVar6) {
        this->TestLoad = local_1d8;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Invalid value for \'Test Load\' : ",0x20);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,pbVar1[*i]._M_dataplus._M_p,
                             pbVar1[*i]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x6d8,local_1d0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
      }
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->CompressTestOutput = false;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->PrintLabels = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->UseHTTP10 = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      dVar4 = atof(pbVar1[sVar9]._M_dataplus._M_p);
      this->GlobalTimeout = dVar4;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    std::__cxx11::string::_M_assign((string *)&this->StopTime);
    DetermineNextDayStop(this);
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      SetConfigType(this,pbVar1[sVar9]._M_dataplus._M_p);
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->Debug = true;
    this->ShowLineNumbers = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    std::__cxx11::string::_M_assign((string *)&this->SpecificTrack);
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->ShowLineNumbers = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->LabelSummary = false;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->SubprojectSummary = false;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    this->Quiet = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    this->Verbose = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->BatchJobs = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    this->Verbose = true;
    this->ExtraVerbose = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->OutputTestOutputOnTestFailure = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      bVar6 = cmSystemTools::StringToLong(pbVar1[sVar9]._M_dataplus._M_p,(long *)&local_1d8);
      if (bVar6) {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
        ppcVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                   ::operator[](&this->TestingHandlers,(key_type *)local_1b0);
        pcVar3 = *ppcVar12;
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
        }
        if (pcVar3 != (mapped_type)0x0) {
          *(undefined4 *)
           ((long)&pcVar3[1].PersistentOptions._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
               = (undefined4)local_1d8;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Invalid value for \'--test-output-size-passed\': ",0x2f);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,pbVar1[*i]._M_dataplus._M_p,
                             pbVar1[*i]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x726,local_1d0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
      }
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      bVar6 = cmSystemTools::StringToLong(pbVar1[sVar9]._M_dataplus._M_p,(long *)&local_1d8);
      if (bVar6) {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
        ppcVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                   ::operator[](&this->TestingHandlers,(key_type *)local_1b0);
        pcVar3 = *ppcVar12;
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
        }
        if (pcVar3 != (mapped_type)0x0) {
          *(undefined4 *)&pcVar3[1].Command = (undefined4)local_1d8;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Invalid value for \'--test-output-size-failed\': ",0x2f);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,pbVar1[*i]._M_dataplus._M_p,
                             pbVar1[*i]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x735,local_1d0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
      }
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    this->ShowOnly = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      SetOutputLogFileName(this,pbVar1[sVar9]._M_dataplus._M_p);
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->TomorrowTag = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    this->ForceNewCTestProcess = true;
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      iVar7 = atoi(pbVar1[sVar9]._M_dataplus._M_p);
      this->MaxTestNameWidth = iVar7;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      bVar6 = cmSystemTools::IsOn(pbVar1[sVar9]._M_dataplus._M_p);
      this->InteractiveDebugMode = bVar6;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      iVar8 = atoi(pbVar1[sVar9]._M_dataplus._M_p);
      iVar7 = 0;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      this->SubmitIndex = iVar7;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (iVar7 == 0) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar9 = *i + 1;
      *i = sVar9;
      AddCTestConfigurationOverwrite(this,pbVar1 + sVar9);
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    this->ProduceXML = true;
    SetTest(this,"Notes",true);
    sVar9 = *i;
    *i = sVar9 + 1;
    SetNotesFiles(this,(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[sVar9 + 1]._M_dataplus._M_p);
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"TestsToRunInformation","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"TestsToRunInformation","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) {
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"UseUnion","");
    cmCTestGenericHandler::SetPersistentOption(pcVar14,(string *)local_1b0,"true");
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"UseUnion","");
    cmCTestGenericHandler::SetPersistentOption(pcVar14,(string *)local_1b0,"true");
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"IncludeRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"IncludeRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"LabelRegularExpression","")
    ;
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeLabelRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureSetupRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureSetupRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_1f8), iVar7 == 0)) &&
     (*i < ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *i = *i + 1;
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureCleanupRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"ExcludeFixtureCleanupRegularExpression","");
    cmCTestGenericHandler::SetPersistentOption
              (pcVar14,(string *)local_1b0,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[*i]._M_dataplus._M_p);
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_1f8);
  bVar6 = true;
  if (iVar7 == 0) {
    pcVar14 = GetHandler(this,"test");
    pp_Var15 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"RerunFailed","");
    cmCTestGenericHandler::SetPersistentOption(pcVar14,(string *)local_1b0,"true");
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    pcVar14 = GetHandler(this,"memcheck");
    local_1b0._0_8_ = pp_Var15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"RerunFailed","");
    cmCTestGenericHandler::SetPersistentOption(pcVar14,(string *)local_1b0,"true");
    if ((_func_int **)local_1b0._0_8_ != pp_Var15) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
  }
LAB_00291cfa:
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F")) {
    this->Failover = true;
  }
  if (this->CheckArgument(arg, "-j", "--parallel") && i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  } else if (arg.find("-j") == 0) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->ParallelLevelSetInCli = true;
  }
  if (this->CheckArgument(arg, "--repeat-until-fail")) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmSystemTools::StringToLong(args[i].c_str(), &repeat)) {
      errormsg =
        "'--repeat-until-fail' given non-integer value '" + args[i] + "'";
      return false;
    }
    this->RepeatTests = static_cast<int>(repeat);
    if (repeat > 1) {
      this->RepeatUntilFail = true;
    }
  }

  if (this->CheckArgument(arg, "--test-load") && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmSystemTools::StringToULong(args[i].c_str(), &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  if (this->CheckArgument(arg, "--no-compress-output")) {
    this->CompressTestOutput = false;
  }

  if (this->CheckArgument(arg, "--print-labels")) {
    this->PrintLabels = true;
  }

  if (this->CheckArgument(arg, "--http1.0")) {
    this->UseHTTP10 = true;
  }

  if (this->CheckArgument(arg, "--timeout") && i < args.size() - 1) {
    i++;
    double timeout = (double)atof(args[i].c_str());
    this->GlobalTimeout = timeout;
  }

  if (this->CheckArgument(arg, "--stop-time") && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  if (this->CheckArgument(arg, "-C", "--build-config") &&
      i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--debug")) {
    this->Debug = true;
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--track") && i < args.size() - 1) {
    i++;
    this->SpecificTrack = args[i];
  }
  if (this->CheckArgument(arg, "--show-line-numbers")) {
    this->ShowLineNumbers = true;
  }
  if (this->CheckArgument(arg, "--no-label-summary")) {
    this->LabelSummary = false;
  }
  if (this->CheckArgument(arg, "--no-subproject-summary")) {
    this->SubprojectSummary = false;
  }
  if (this->CheckArgument(arg, "-Q", "--quiet")) {
    this->Quiet = true;
  }
  if (this->CheckArgument(arg, "-V", "--verbose")) {
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "-B")) {
    this->BatchJobs = true;
  }
  if (this->CheckArgument(arg, "-VV", "--extra-verbose")) {
    this->ExtraVerbose = true;
    this->Verbose = true;
  }
  if (this->CheckArgument(arg, "--output-on-failure")) {
    this->OutputTestOutputOnTestFailure = true;
  }
  if (this->CheckArgument(arg, "--test-output-size-passed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizePassed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "--test-output-size-failed") &&
      i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmSystemTools::StringToLong(args[i].c_str(), &outputSize)) {
      if (cmCTestTestHandler* pCTestTestHandler =
            static_cast<cmCTestTestHandler*>(this->TestingHandlers["test"])) {
        pCTestTestHandler->SetTestOutputSizeFailed(int(outputSize));
      }
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  }
  if (this->CheckArgument(arg, "-N", "--show-only")) {
    this->ShowOnly = true;
  }

  if (this->CheckArgument(arg, "-O", "--output-log") && i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i].c_str());
  }

  if (this->CheckArgument(arg, "--tomorrow-tag")) {
    this->TomorrowTag = true;
  }
  if (this->CheckArgument(arg, "--force-new-ctest-process")) {
    this->ForceNewCTestProcess = true;
  }
  if (this->CheckArgument(arg, "-W", "--max-width") && i < args.size() - 1) {
    i++;
    this->MaxTestNameWidth = atoi(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--interactive-debug-mode") &&
      i < args.size() - 1) {
    i++;
    this->InteractiveDebugMode = cmSystemTools::IsOn(args[i].c_str());
  }
  if (this->CheckArgument(arg, "--submit-index") && i < args.size() - 1) {
    i++;
    this->SubmitIndex = atoi(args[i].c_str());
    if (this->SubmitIndex < 0) {
      this->SubmitIndex = 0;
    }
  }

  if (this->CheckArgument(arg, "--overwrite") && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  }
  if (this->CheckArgument(arg, "-A", "--add-notes") && i < args.size() - 1) {
    this->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i].c_str());
  }

  // options that control what tests are run
  if (this->CheckArgument(arg, "-I", "--tests-information") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("TestsToRunInformation",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("TestsToRunInformation", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-U", "--union")) {
    this->GetHandler("test")->SetPersistentOption("UseUnion", "true");
    this->GetHandler("memcheck")->SetPersistentOption("UseUnion", "true");
  }
  if (this->CheckArgument(arg, "-R", "--tests-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("IncludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("IncludeRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-L", "--label-regex") && i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("LabelRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("LabelRegularExpression", args[i].c_str());
  }
  if (this->CheckArgument(arg, "-LE", "--label-exclude") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeLabelRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeLabelRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-E", "--exclude-regex") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption("ExcludeRegularExpression",
                                                  args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeRegularExpression", args[i].c_str());
  }

  if (this->CheckArgument(arg, "-FA", "--fixture-exclude-any") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FS", "--fixture-exclude-setup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureSetupRegularExpression",
                            args[i].c_str());
  }
  if (this->CheckArgument(arg, "-FC", "--fixture-exclude-cleanup") &&
      i < args.size() - 1) {
    i++;
    this->GetHandler("test")->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetHandler("memcheck")
      ->SetPersistentOption("ExcludeFixtureCleanupRegularExpression",
                            args[i].c_str());
  }

  if (this->CheckArgument(arg, "--rerun-failed")) {
    this->GetHandler("test")->SetPersistentOption("RerunFailed", "true");
    this->GetHandler("memcheck")->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}